

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O3

void ModuleEntry(Environment *env)

{
  undefined4 uVar1;
  _func_void_Environment_ptr *extraout_RDX;
  Word WVar2;
  long *local_40 [2];
  long local_30 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Std library loaded",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"hello","");
  uVar1 = huelang::DefinitionTable::TokToWord(env,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  WVar2.minor._0_4_ = uVar1;
  WVar2._0_8_ = env;
  WVar2.minor._4_4_ = 0;
  huelang::Environment::AddPrimaryDefinition(WVar2,extraout_RDX);
  return;
}

Assistant:

void ModuleEntry(Environment *env) {
    cout << "Std library loaded" << endl;
    Word helloword = env->definitionTable.TokToWord("hello");
    env->AddPrimaryDefinition(helloword, &__hello);
}